

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

bool __thiscall QPDF::checkLinearization(QPDF *this)

{
  bool bVar1;
  
  readLinearizationData(this);
  bVar1 = checkLinearizationInternal(this);
  return bVar1;
}

Assistant:

bool
QPDF::checkLinearization()
{
    bool result = false;
    try {
        readLinearizationData();
        result = checkLinearizationInternal();
    } catch (std::runtime_error& e) {
        linearizationWarning(
            "error encountered while checking linearization data: " + std::string(e.what()));
    }
    return result;
}